

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_relaxation.c
# Opt level: O0

int ARKodeSetRelaxResTol(void *arkode_mem,sunrealtype res_tol)

{
  double in_XMM0_Qa;
  ARKodeRelaxMem relax_mem;
  ARKodeMem ark_mem;
  int retval;
  ARKodeMem *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  ARKodeMem in_stack_ffffffffffffffd8;
  int local_4;
  
  local_4 = arkRelaxAccessMem(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                              in_stack_ffffffffffffffc8,(ARKodeRelaxMem *)0x18f88a);
  if (local_4 == 0) {
    if (in_stack_ffffffffffffffd8->step_supports_relaxation == 0) {
      arkProcessError(in_stack_ffffffffffffffd8,-0x30,0x23e,"ARKodeSetRelaxResTol",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_relaxation.c"
                      ,"time-stepping module does not support relaxation");
      local_4 = -0x30;
    }
    else {
      if (in_XMM0_Qa <= 0.0) {
        in_stack_ffffffffffffffd0[0x90] = '\0';
        in_stack_ffffffffffffffd0[0x91] = '\0';
        in_stack_ffffffffffffffd0[0x92] = '\0';
        in_stack_ffffffffffffffd0[0x93] = '\0';
        in_stack_ffffffffffffffd0[0x94] = '\0';
        in_stack_ffffffffffffffd0[0x95] = '\0';
        in_stack_ffffffffffffffd0[0x96] = -0x1c;
        in_stack_ffffffffffffffd0[0x97] = '<';
      }
      else {
        *(double *)(in_stack_ffffffffffffffd0 + 0x90) = in_XMM0_Qa;
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int ARKodeSetRelaxResTol(void* arkode_mem, sunrealtype res_tol)
{
  int retval;
  ARKodeMem ark_mem;
  ARKodeRelaxMem relax_mem;

  retval = arkRelaxAccessMem(arkode_mem, __func__, &ark_mem, &relax_mem);
  if (retval) { return retval; }

  /* Guard against use for time steppers that do not allow relaxation */
  if (!ark_mem->step_supports_relaxation)
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "time-stepping module does not support relaxation");
    return (ARK_STEPPER_UNSUPPORTED);
  }

  if (res_tol > ZERO) { relax_mem->res_tol = res_tol; }
  else { relax_mem->res_tol = ARK_RELAX_DEFAULT_RES_TOL; }

  return ARK_SUCCESS;
}